

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
::destroy_slots(raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
                *this)

{
  size_t sVar1;
  long lVar2;
  size_t i;
  size_t sVar3;
  Layout LVar4;
  
  sVar1 = this->capacity_;
  if (sVar1 != 0) {
    lVar2 = 0;
    for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
      if (-1 < this->ctrl_[sVar3]) {
        node_hash_policy<phmap::priv::hash_internal::EnumClass&,phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>>
        ::destroy<phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>
                  ((Alloc<phmap::priv::hash_internal::EnumClass> *)&this->settings_,
                   (slot_type *)((long)this->slots_ + lVar2));
      }
      lVar2 = lVar2 + 8;
    }
    LVar4 = MakeLayout(this->capacity_);
    Deallocate<8ul,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>
              ((Alloc<phmap::priv::hash_internal::EnumClass> *)&this->settings_,this->ctrl_,
               (LVar4.
                super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::hash_internal::EnumClass_*>
                .size_[0] + 7 & 0xfffffffffffffff8) +
               LVar4.
               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::hash_internal::EnumClass_*>
               .size_[1] * 8);
    (this->settings_).
    super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
    this->ctrl_ = (ctrl_t *)0x0;
    this->slots_ = (slot_type *)0x0;
    this->size_ = 0;
    this->capacity_ = 0;
  }
  return;
}

Assistant:

void destroy_slots() {
        if (!capacity_)
            return;
        
        PHMAP_IF_CONSTEXPR((!std::is_trivially_destructible<typename PolicyTraits::value_type>::value ||
                            std::is_same<typename Policy::is_flat, std::false_type>::value)) {
            // node map, or not trivially destructible... we  need to iterate and destroy values one by one
            // std::cout << "either this is a node map or " << type_name<typename PolicyTraits::value_type>()  << " is not trivially_destructible\n";
            for (size_t i = 0, cnt = capacity_; i != cnt; ++i) {
                if (IsFull(ctrl_[i])) {
                    PolicyTraits::destroy(&alloc_ref(), slots_ + i);
                }
            }
        } 
        auto layout = MakeLayout(capacity_);
        // Unpoison before returning the memory to the allocator.
        SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
        Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
        ctrl_ = EmptyGroup<std_alloc_t>();
        slots_ = nullptr;
        size_ = 0;
        capacity_ = 0;
        growth_left() = 0;
    }